

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O0

void anon_unknown.dwarf_108296::fill2(unsigned_short *data,int n,int m,Rand48 *rand48)

{
  long lVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar2;
  int i_1;
  int i;
  undefined4 local_20;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    *(undefined2 *)(in_RDI + (long)local_1c * 2) = 0;
  }
  for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
    dVar2 = Imath_3_2::Rand48::nextf((Rand48 *)0x1c0ba1);
    lVar1 = Imath_3_2::Rand48::nexti((Rand48 *)0x1c0bca);
    *(short *)(in_RDI + (lVar1 % (long)in_ESI) * 2) = (short)(int)(dVar2 * 65536.0);
  }
  return;
}

Assistant:

void
fill2 (
    unsigned short data[/*n*/], int n, int m, IMATH_NAMESPACE::Rand48& rand48)
{
    for (int i = 0; i < n; ++i)
        data[i] = 0;

    for (int i = 0; i < m; ++i)
        data[rand48.nexti () % n] =
            (unsigned short) (rand48.nextf () * (USHRT_MAX + 1));
}